

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetFallbackEntropyFunction(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_59;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,type);
  __l._M_len = 1;
  __l._M_array = &local_28;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  LogicalType::LogicalType(&local_58,DOUBLE);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,&local_58,
             AggregateFunction::StateSize<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>,
             AggregateFunction::
             StateInitialize<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>,(duckdb::AggregateDestructorType)1>
             ,AggregateSortKeyHelpers::
              UnaryUpdate<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>,(duckdb::OrderType)2,true>
             ,AggregateFunction::
              StateCombine<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
             ,AggregateFunction::
              StateFinalize<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,double,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
             ,(aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType(&local_28);
  __return_storage_ptr__->destructor =
       AggregateFunction::
       StateDestroy<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
  ;
  (__return_storage_ptr__->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetFallbackEntropyFunction(const LogicalType &type) {
	using STATE = ModeState<string_t, ModeString>;
	using OP = EntropyFallbackFunction<ModeString>;
	AggregateFunction func({type}, LogicalType::DOUBLE, AggregateFunction::StateSize<STATE>,
	                       AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>,
	                       AggregateSortKeyHelpers::UnaryUpdate<STATE, OP>, AggregateFunction::StateCombine<STATE, OP>,
	                       AggregateFunction::StateFinalize<STATE, double, OP>, nullptr);
	func.destructor = AggregateFunction::StateDestroy<STATE, OP>;
	func.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return func;
}